

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int aead_decrypt(st_ptls_traffic_protection_t *ctx,void *output,size_t *outlen,void *input,
                size_t inlen)

{
  st_ptls_aead_context_t *psVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  uint8_t aad [5];
  uint8_t iv [16];
  undefined2 local_5d;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  void *local_58;
  size_t *local_50;
  undefined1 local_48 [24];
  
  local_5d = 0x317;
  local_5b = 3;
  local_5a = (undefined1)(inlen >> 8);
  local_59 = (undefined1)inlen;
  psVar1 = ctx->aead;
  uVar2 = ctx->seq;
  sVar5 = psVar1->algo->iv_size;
  local_50 = outlen;
  if (sVar5 - 8 != 0) {
    local_58 = output;
    memcpy(local_48,psVar1->static_iv,sVar5 - 8);
    output = local_58;
  }
  lVar4 = 0x38;
  do {
    local_48[sVar5 - 8] = (byte)(uVar2 >> ((byte)lVar4 & 0x3f)) ^ psVar1->static_iv[sVar5 - 8];
    lVar4 = lVar4 + -8;
    sVar5 = sVar5 + 1;
  } while (lVar4 != -8);
  sVar5 = (*psVar1->do_decrypt)(psVar1,output,input,inlen,local_48,&local_5d,5);
  *local_50 = sVar5;
  if (sVar5 == 0xffffffffffffffff) {
    iVar3 = 0x14;
  }
  else {
    ctx->seq = ctx->seq + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int aead_decrypt(struct st_ptls_traffic_protection_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen)
{
    uint8_t aad[5];

    build_aad(aad, inlen);
    if ((*outlen = ptls_aead_decrypt(ctx->aead, output, input, inlen, ctx->seq, aad, sizeof(aad))) == SIZE_MAX)
        return PTLS_ALERT_BAD_RECORD_MAC;
    ++ctx->seq;
    return 0;
}